

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fps_compression.cpp
# Opt level: O2

void transpose_xyz_aos_to_soa(char *filename)

{
  int val;
  uint32_t i;
  ulong uVar1;
  uint uVar2;
  size_t __size;
  uint32_t nr_of_vertices;
  float *vertices;
  float *vertices_from_xyz;
  float *z;
  float *y;
  float *x;
  uint32_t *triangles;
  uint32_t nr_of_triangles;
  
  val = trico_read_stl(&nr_of_vertices,&vertices,&nr_of_triangles,&triangles,filename);
  TestEq<int,int>(1,val,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico.tests/fps_compression.cpp"
                  ,0x29,"void transpose_xyz_aos_to_soa(const char *)");
  __size = (ulong)nr_of_vertices << 2;
  x = (float *)malloc(__size);
  y = (float *)malloc(__size);
  z = (float *)malloc(__size);
  anon_unknown.dwarf_2767::tic();
  trico_transpose_xyz_aos_to_soa(&x,&y,&z,vertices,nr_of_vertices);
  anon_unknown.dwarf_2767::toc("transpose_xyz_aos_to_soa time: ");
  uVar2 = 2;
  for (uVar1 = 0; uVar1 < nr_of_vertices; uVar1 = uVar1 + 1) {
    TestEq<float,float>(x[uVar1],vertices[uVar2 - 2],
                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico.tests/fps_compression.cpp"
                        ,0x35,"void transpose_xyz_aos_to_soa(const char *)");
    TestEq<float,float>(y[uVar1],vertices[uVar2 - 1],
                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico.tests/fps_compression.cpp"
                        ,0x36,"void transpose_xyz_aos_to_soa(const char *)");
    TestEq<float,float>(z[uVar1],vertices[uVar2],
                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico.tests/fps_compression.cpp"
                        ,0x37,"void transpose_xyz_aos_to_soa(const char *)");
    uVar2 = uVar2 + 3;
  }
  vertices_from_xyz = (float *)malloc((ulong)nr_of_vertices * 0xc);
  anon_unknown.dwarf_2767::tic();
  trico_transpose_xyz_soa_to_aos(&vertices_from_xyz,x,y,z,nr_of_vertices);
  anon_unknown.dwarf_2767::toc("transpose_xyz_soa_to_aos time: ");
  uVar2 = 2;
  for (uVar1 = 0; uVar1 < nr_of_vertices; uVar1 = uVar1 + 1) {
    TestEq<float,float>(x[uVar1],vertices_from_xyz[uVar2 - 2],
                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico.tests/fps_compression.cpp"
                        ,0x42,"void transpose_xyz_aos_to_soa(const char *)");
    TestEq<float,float>(y[uVar1],vertices_from_xyz[uVar2 - 1],
                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico.tests/fps_compression.cpp"
                        ,0x43,"void transpose_xyz_aos_to_soa(const char *)");
    TestEq<float,float>(z[uVar1],vertices_from_xyz[uVar2],
                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico.tests/fps_compression.cpp"
                        ,0x44,"void transpose_xyz_aos_to_soa(const char *)");
    uVar2 = uVar2 + 3;
  }
  free(vertices_from_xyz);
  free(x);
  free(y);
  free(z);
  free(vertices);
  free(triangles);
  return;
}

Assistant:

void transpose_xyz_aos_to_soa(const char* filename)
  {
  uint32_t nr_of_vertices;
  float* vertices;
  uint32_t nr_of_triangles;
  uint32_t* triangles;

  TEST_EQ(1, trico_read_stl(&nr_of_vertices, &vertices, &nr_of_triangles, &triangles, filename));

  float* x = (float*)trico_malloc(sizeof(float)*nr_of_vertices);
  float* y = (float*)trico_malloc(sizeof(float)*nr_of_vertices);
  float* z = (float*)trico_malloc(sizeof(float)*nr_of_vertices);

  tic();
  trico_transpose_xyz_aos_to_soa(&x, &y, &z, vertices, nr_of_vertices);
  toc("transpose_xyz_aos_to_soa time: ");

  for (uint32_t i = 0; i < nr_of_vertices; ++i)
    {
    TEST_EQ(x[i], vertices[i * 3]);
    TEST_EQ(y[i], vertices[i * 3 + 1]);
    TEST_EQ(z[i], vertices[i * 3 + 2]);
    }

  float* vertices_from_xyz = (float*)trico_malloc(sizeof(float)*nr_of_vertices * 3);

  tic();
  trico_transpose_xyz_soa_to_aos(&vertices_from_xyz, x, y, z, nr_of_vertices);
  toc("transpose_xyz_soa_to_aos time: ");

  for (uint32_t i = 0; i < nr_of_vertices; ++i)
    {
    TEST_EQ(x[i], vertices_from_xyz[i * 3]);
    TEST_EQ(y[i], vertices_from_xyz[i * 3 + 1]);
    TEST_EQ(z[i], vertices_from_xyz[i * 3 + 2]);
    }

  trico_free(vertices_from_xyz);
  trico_free(x);
  trico_free(y);
  trico_free(z);
  trico_free(vertices);
  trico_free(triangles);
  }